

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
visit<slang::ast::ConcurrentAssertionStatement>
          (ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *this,
          ConcurrentAssertionStatement *t)

{
  bool bVar1;
  DiagnosticVisitor *in_RSI;
  ConcurrentAssertionStatement *in_RDI;
  
  bVar1 = Statement::bad((Statement *)in_RSI);
  if (!bVar1) {
    DiagnosticVisitor::handle<slang::ast::ConcurrentAssertionStatement>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }